

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

void __thiscall anon_unknown.dwarf_51301::SetExpr::dump(SetExpr *this)

{
  uint uVar1;
  ulong *puVar2;
  uint uVar3;
  char cVar4;
  int iVar5;
  ulong uVar6;
  ulong *puVar7;
  
  fputc(0x5b,_stderr);
  puVar7 = (this->mSetExpr).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  puVar2 = (this->mSetExpr).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
  uVar1 = (this->mSetExpr).super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
  if (uVar1 != 0 || puVar7 != puVar2) {
    cVar4 = '\0';
    uVar6 = 0;
    do {
      if ((*puVar7 >> (uVar6 & 0x3f) & 1) != 0) {
        fputc((int)cVar4,_stderr);
      }
      cVar4 = cVar4 + '\x01';
      iVar5 = (int)uVar6;
      puVar7 = puVar7 + (iVar5 == 0x3f);
      uVar3 = iVar5 + 1;
      if (iVar5 == 0x3f) {
        uVar3 = 0;
      }
      uVar6 = (ulong)uVar3;
    } while (uVar3 != uVar1 || puVar7 != puVar2);
  }
  fputc(0x5d,_stderr);
  return;
}

Assistant:

virtual void dump() const
	{
		fprintf(stderr, "[");
		char c = 0;
		for (bool v : mSetExpr)
		{
			if (v)
				fprintf(stderr, "%c", c);
			c++;
		}
		fprintf(stderr, "]");
	}